

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_scanner.h
# Opt level: O3

void __thiscall CMakeScanner::CMakeScanner(CMakeScanner *this)

{
  symbol_type *psVar1;
  int iVar2;
  runtime_error *this_00;
  
  this->yyscanner = (yyscan_t)0x0;
  (this->scannerCtx).isBracketArg = false;
  (this->scannerCtx).bracketsLength = 0;
  (this->scannerCtx).stringLiteral.literal._M_dataplus._M_p =
       (pointer)&(this->scannerCtx).stringLiteral.literal.field_2;
  (this->scannerCtx).stringLiteral.literal._M_string_length = 0;
  (this->scannerCtx).stringLiteral.literal.field_2._M_local_buf[0] = '\0';
  (this->scannerCtx).stringLiteral.isId = true;
  (this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.super_by_kind.kind_ =
       S_YYEMPTY;
  *(undefined8 *)&(this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.value.field_0
       = 0;
  *(undefined8 *)
   ((long)&(this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.value.field_0 + 8) =
       0;
  *(undefined8 *)
   ((long)&(this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.value.field_0 + 0x10
   ) = 0;
  *(undefined8 *)
   ((long)&(this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.value.field_0 + 0x18
   ) = 0;
  (this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.value.yytypeid_ =
       (type_info *)0x0;
  (this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.location.begin.filename =
       (filename_type *)0x0;
  psVar1 = &(this->scannerCtx).nextToken;
  (psVar1->super_basic_symbol<yy::parser::by_kind>).location.begin.line = 1;
  (psVar1->super_basic_symbol<yy::parser::by_kind>).location.begin.column = 1;
  (this->scannerCtx).nextToken.super_basic_symbol<yy::parser::by_kind>.location.end.filename =
       (filename_type *)0x0;
  psVar1 = &(this->scannerCtx).nextToken;
  (psVar1->super_basic_symbol<yy::parser::by_kind>).location.end.line = 1;
  (psVar1->super_basic_symbol<yy::parser::by_kind>).location.end.column = 1;
  (this->scannerCtx).location.begin.filename = (filename_type *)0x0;
  (this->scannerCtx).location.begin.line = 1;
  (this->scannerCtx).location.begin.column = 1;
  (this->scannerCtx).location.end.filename = (filename_type *)0x0;
  (this->scannerCtx).location.end.line = 1;
  (this->scannerCtx).location.end.column = 1;
  (this->scannerCtx).filepath._M_dataplus._M_p = (pointer)&(this->scannerCtx).filepath.field_2;
  (this->scannerCtx).filepath._M_string_length = 0;
  (this->scannerCtx).filepath.field_2._M_local_buf[0] = '\0';
  this->file = (FILE *)0x0;
  this->stringBuf = (YY_BUFFER_STATE)0x0;
  iVar2 = yylex_init(&this->yyscanner);
  if (iVar2 == 0) {
    iVar2 = yylex_init_extra(&this->scannerCtx,&this->yyscanner);
    if (iVar2 == 0) {
      return;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"yylex_init_extra() error");
  }
  else {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"yylex_init() error");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

CMakeScanner()
    {
        if(yylex_init(&yyscanner))
        {
            throw std::runtime_error{"yylex_init() error"};
        }

        if(yylex_init_extra(&scannerCtx, &yyscanner))
        {
            throw std::runtime_error{"yylex_init_extra() error"};
        }
    }